

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O3

ggml_tensor * __thiscall test_ssm_conv::build_graph(test_ssm_conv *this,ggml_context *ctx)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ggml_tensor *pgVar3;
  
  uVar1 = ggml_new_tensor(ctx,this->type,4,&this->ne_a);
  test_case::add_sentinel(&this->super_test_case,ctx);
  uVar2 = ggml_new_tensor(ctx,this->type,4,&this->ne_b);
  test_case::add_sentinel(&this->super_test_case,ctx);
  pgVar3 = (ggml_tensor *)ggml_ssm_conv(ctx,uVar1,uVar2);
  return pgVar3;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * a   = ggml_new_tensor(ctx, type, 4, ne_a.data());
        ggml_tensor * b   = ggml_new_tensor(ctx, type, 4, ne_b.data());
        ggml_tensor * out = ggml_ssm_conv(ctx, a, b);
        return out;
    }